

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testCaseEnded(XmlReporter *this,TestCaseStats *testCaseStats)

{
  int iVar1;
  IConfig *pIVar2;
  long in_RSI;
  XmlWriter *in_RDI;
  ScopedElement e;
  TestCaseStats *in_stack_ffffffffffffff08;
  StreamingReporterBase *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  allocator *paVar3;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  XmlWriter *in_stack_ffffffffffffff38;
  allocator local_99;
  string local_98 [38];
  undefined1 local_72;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [40];
  long local_10;
  
  local_10 = in_RSI;
  StreamingReporterBase::testCaseEnded(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"OverallResult",&local_39);
  XmlWriter::scopedElement
            (in_stack_ffffffffffffff38,
             (string *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  paVar3 = &local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"success",paVar3);
  local_72 = Counts::allOk((Counts *)(local_10 + 0x118));
  XmlWriter::ScopedElement::writeAttribute<bool>
            ((ScopedElement *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18,(bool *)in_stack_ffffffffffffff10);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  pIVar2 = Ptr<const_Catch::IConfig>::operator->
                     ((Ptr<const_Catch::IConfig> *)
                      &(in_RDI->m_tags).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  iVar1 = (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])();
  if (iVar1 == 1) {
    paVar3 = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"durationInSeconds",paVar3);
    in_stack_ffffffffffffff10 = (StreamingReporterBase *)Timer::getElapsedSeconds((Timer *)0x1b6cbf)
    ;
    XmlWriter::ScopedElement::writeAttribute<double>
              ((ScopedElement *)CONCAT44(iVar1,in_stack_ffffffffffffff20),(string *)paVar3,
               (double *)in_stack_ffffffffffffff10);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  XmlWriter::endElement(in_RDI);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_ffffffffffffff10);
  return;
}

Assistant:

virtual void testCaseEnded( TestCaseStats const& testCaseStats ) CATCH_OVERRIDE {
            StreamingReporterBase::testCaseEnded( testCaseStats );
            XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResult" );
            e.writeAttribute( "success", testCaseStats.totals.assertions.allOk() );

            if ( m_config->showDurations() == ShowDurations::Always )
                e.writeAttribute( "durationInSeconds", m_testCaseTimer.getElapsedSeconds() );

            m_xml.endElement();
        }